

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uint ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubD
               (uint adaptive_subd_display_density,ON_SubD *subd)

{
  uint uVar1;
  uint display_density;
  ON_SubD *subd_local;
  uint adaptive_subd_display_density_local;
  
  uVar1 = ON_SubD::FaceCount(subd);
  uVar1 = AbsoluteDisplayDensityFromSubDFaceCount(adaptive_subd_display_density,uVar1);
  return uVar1;
}

Assistant:

unsigned int ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubD(
  unsigned adaptive_subd_display_density,
  const ON_SubD& subd
)
{
  // If this function changes, then a parallel change must be made in
  // ON_SubDLevel::CopyEvaluationCacheForExperts(const ON_SubDLevel& src, ON_SubDHeap& this_heap)
  // so it uses the same automatic density value.
  unsigned int display_density = ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount(adaptive_subd_display_density, subd.FaceCount());
  return display_density;
}